

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heartbleed.c
# Opt level: O2

int dtls1_process_heartbeat(SSL *s)

{
  uint i;
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar *buf;
  SSL *s_00;
  uint uVar4;
  uchar *puVar5;
  
  puVar5 = (s->s3->rrec).data;
  uVar1 = *puVar5;
  uVar2 = puVar5[1];
  uVar3 = puVar5[2];
  if (s->msg_callback != (_func_void_int_int_int_void_ptr_size_t_void_ptr_void_ptr *)0x0) {
    (*s->msg_callback)(0,s->version,0x18,puVar5,(long)(s->s3->rrec).length,s,s->msg_callback_arg);
  }
  uVar4 = (uint)CONCAT11(uVar2,uVar3);
  if (uVar1 == '\x02') {
    if ((uVar4 == 0x12) &&
       (uVar4 = (uint)(ushort)(*(ushort *)(puVar5 + 3) << 8 | *(ushort *)(puVar5 + 3) >> 8),
       uVar4 == s->tlsext_hb_seq)) {
      s->tlsext_hb_seq = uVar4 + 1;
      s->tlsext_hb_pending = 0;
    }
  }
  else if (uVar1 == '\x01') {
    puVar5 = puVar5 + 3;
    i = uVar4 + 0x13;
    buf = OPENSSL_malloc(i);
    *buf = '\x02';
    buf[1] = uVar2;
    buf[2] = uVar3;
    s_00 = (SSL *)(buf + 3);
    memcpy(s_00,puVar5,(ulong)uVar4);
    dtls1_write_bytes(s_00,(int)puVar5,buf,i);
    if (s->msg_callback != (_func_void_int_int_int_void_ptr_size_t_void_ptr_void_ptr *)0x0) {
      (*s->msg_callback)(1,s->version,0x18,buf,(size_t)i,s,s->msg_callback_arg);
    }
    free(buf);
  }
  return 0;
}

Assistant:

int
dtls1_process_heartbeat(SSL *s) {
  unsigned char *p = &s->s3->rrec.data[0], *pl;
  unsigned short hbtype;
  unsigned int payload;
  unsigned int padding = 16; /* Use minimum padding */

  /* Read type and payload length first */
  hbtype = *p++;
  n2s(p, payload);
  pl = p;

  if (s->msg_callback)
    s->msg_callback(0, s->version, TLS1_RT_HEARTBEAT,
                    &s->s3->rrec.data[0], s->s3->rrec.length,
                    s, s->msg_callback_arg);

  if (hbtype == TLS1_HB_REQUEST) {
    unsigned char *buffer, *bp;
    int r;

    /* Allocate memory for the response, size is 1 byte
     * message type, plus 2 bytes payload length, plus
     * payload, plus padding
     */
    buffer = OPENSSL_malloc(1 + 2 + payload + padding);
    bp = buffer;

    /* Enter response type, length and copy payload */
    *bp++ = TLS1_HB_RESPONSE;
    s2n(payload, bp);
    memcpy(bp, pl, payload);
    bp += payload;
    /* Random padding */
    RAND_pseudo_bytes(bp, padding);

    r = dtls1_write_bytes(s, TLS1_RT_HEARTBEAT, buffer, 3 + payload + padding);

    if (r >= 0 && s->msg_callback)
      s->msg_callback(1, s->version, TLS1_RT_HEARTBEAT,
                      buffer, 3 + payload + padding,
                      s, s->msg_callback_arg);

    OPENSSL_free(buffer);

    if (r < 0)
      return r;
  } else if (hbtype == TLS1_HB_RESPONSE) {
    unsigned int seq;

    /* We only send sequence numbers (2 bytes unsigned int),
     * and 16 random bytes, so we just try to read the
     * sequence number */
    n2s(pl, seq);

    if (payload == 18 && seq == s->tlsext_hb_seq) {
      dtls1_stop_timer(s);
      s->tlsext_hb_seq++;
      s->tlsext_hb_pending = 0;
    }
  }

  return 0;
}